

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

boolean Can_rise_up(level *lev,int x,int y)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  
  cVar1 = (lev->z).dnum;
  if (cVar1 == dungeon_topology.d_astral_level.dnum) {
    return '\0';
  }
  if (cVar1 == dungeon_topology.d_sokoban_dnum) {
    return '\0';
  }
  if (((cVar1 != dungeon_topology.d_wiz1_level.dnum) ||
      ((lev->z).dlevel != dungeon_topology.d_wiz1_level.dlevel)) ||
     (bVar3 = In_W_tower(lev,x,y), bVar3 == '\0')) {
    cVar1 = (lev->z).dlevel;
    if ('\x01' < cVar1) {
      return '\x01';
    }
    cVar2 = (lev->z).dnum;
    if (((dungeons[cVar2].entry_lev == '\x01') &&
        ((char)(cVar1 + (char)dungeons[cVar2].ledger_start) != '\x01')) &&
       ((lev->sstairs).sx != '\0')) {
      return (lev->sstairs).up != '\0';
    }
  }
  return '\0';
}

Assistant:

boolean Can_rise_up(const struct level *lev, int x, int y)
{
    /* can't rise up from inside the top of the Wizard's tower */
    /* KMH -- or in sokoban */
    if (In_endgame(&lev->z) || In_sokoban(&lev->z) ||
			(Is_wiz1_level(&lev->z) && In_W_tower(lev, x, y)))
	return FALSE;
    return (boolean)(lev->z.dlevel > 1 ||
		(dungeons[lev->z.dnum].entry_lev == 1 && ledger_no(&lev->z) != 1 &&
		 lev->sstairs.sx && lev->sstairs.up));
}